

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::replaceOldData(StateData *this,MultiFab *mf)

{
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *in_RDI;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *in_stack_ffffffffffffffd8;
  MultiFab *in_stack_ffffffffffffffe8;
  
  std::make_unique<amrex::MultiFab,amrex::MultiFab>(in_stack_ffffffffffffffe8);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
            (in_RDI,in_stack_ffffffffffffffd8);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr(in_RDI);
  return;
}

Assistant:

void
StateData::replaceOldData (MultiFab&& mf)
{
    old_data = std::make_unique<MultiFab>(std::move(mf));
}